

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::escaped_newline(sequence *__return_storage_ptr__,spec *s)

{
  void *pvVar1;
  pointer __p;
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  repeat_at_least local_110;
  either local_f8;
  character_either local_d8;
  character_either local_b8;
  repeat_at_least local_98;
  character local_80;
  either local_70;
  literal local_50;
  character local_38;
  
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_80.value_ = '\\';
  local_f8.super_scanner_base._vptr_scanner_base._0_2_ = 0x920;
  cs._M_len = 2;
  cs._M_array = (iterator)&local_f8;
  character_either::character_either(&local_d8,cs);
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00568a40;
  local_98.length_ = 0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_98.other_,&local_d8);
  if (local_d8.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_b8.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 10;
  local_f8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005688e0;
  local_f8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x45e109;
  local_f8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  either::either<toml::detail::character,toml::detail::literal>
            ((either *)&local_d8,(character *)&local_b8,(literal *)&local_f8);
  local_70.super_scanner_base._vptr_scanner_base._0_2_ = 0x920;
  cs_00._M_len = 2;
  cs_00._M_array = (iterator)&local_70;
  character_either::character_either(&local_b8,cs_00);
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_38.value_ = '\n';
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005688e0;
  local_50.value_ = "\r\n";
  local_50.size_ = 2;
  either::either<toml::detail::character,toml::detail::literal>(&local_70,&local_38,&local_50);
  either::either<toml::detail::character_either,toml::detail::either>(&local_f8,&local_b8,&local_70)
  ;
  local_110.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00568a40;
  local_110.length_ = 0;
  local_110.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_110.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_00568990;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_f8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_f8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_f8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_50);
  sequence::
  sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::either,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_80,&local_98,(either *)&local_d8,&local_110);
  if (local_110.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_110.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_110.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  pvVar1 = (void *)CONCAT71(local_b8.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_b8.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b8.chars_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &local_d8.chars_);
  if (local_98.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_98.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence escaped_newline(const spec& s)
{
    return sequence(
            character('\\'), ws(s), newline(s),
            repeat_at_least(0, either(wschar(s), newline(s)))
        );
}